

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

void __thiscall
fasttext::FastText::skipgram
          (FastText *this,State *state,real lr,vector<int,_std::allocator<int>_> *line)

{
  result_type_conflict1 rVar1;
  vector<int,_std::allocator<int>_> *input;
  uint targetIndex;
  int iVar2;
  int32_t w;
  ulong uVar3;
  uniform_int_distribution<int> uniform;
  uniform_int_distribution<int> local_38;
  
  local_38._M_param._M_b =
       ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->ws;
  local_38._M_param._M_a = 1;
  for (uVar3 = 0;
      uVar3 < (ulong)((long)(line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start >> 2); uVar3 = uVar3 + 1) {
    rVar1 = std::uniform_int_distribution<int>::operator()(&local_38,&state->rng);
    input = Dictionary::getSubwords
                      ((this->dict_).
                       super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       (line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start[uVar3]);
    for (iVar2 = -rVar1; iVar2 <= rVar1; iVar2 = iVar2 + 1) {
      if (((iVar2 != 0) && (targetIndex = (int)uVar3 + iVar2, -1 < (int)targetIndex)) &&
         ((ulong)targetIndex <
          (ulong)((long)(line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start >> 2))) {
        Model::update((this->model_).super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,input,line,targetIndex,lr,state);
      }
    }
  }
  return;
}

Assistant:

void FastText::skipgram(
    Model::State& state,
    real lr,
    const std::vector<int32_t>& line) {
  std::uniform_int_distribution<> uniform(1, args_->ws);
  for (int32_t w = 0; w < line.size(); w++) {
    int32_t boundary = uniform(state.rng);
    const std::vector<int32_t>& ngrams = dict_->getSubwords(line[w]);
    for (int32_t c = -boundary; c <= boundary; c++) {
      if (c != 0 && w + c >= 0 && w + c < line.size()) {
        model_->update(ngrams, line, w + c, lr, state);
      }
    }
  }
}